

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

ProfilerPrintFormat __thiscall
duckdb::QueryProfiler::GetPrintFormat(QueryProfiler *this,ExplainFormat format)

{
  ProfilerPrintFormat PVar1;
  NotImplementedException *this_00;
  ulong uVar2;
  undefined7 in_register_00000031;
  string local_60;
  string local_40;
  
  uVar2 = CONCAT71(in_register_00000031,format) & 0xffffffff;
  switch(uVar2) {
  case 0:
    PVar1 = (this->context->config).profiler_print_format;
    break;
  case 1:
    PVar1 = QUERY_TREE;
    break;
  case 2:
    PVar1 = JSON;
    break;
  case 3:
    PVar1 = HTML;
    break;
  case 4:
    PVar1 = GRAPHVIZ;
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"No mapping from ExplainFormat::%s to ProfilerPrintFormat","");
    EnumUtil::ToString<duckdb::ExplainFormat>(&local_40,(ExplainFormat)uVar2);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return PVar1;
}

Assistant:

ProfilerPrintFormat QueryProfiler::GetPrintFormat(ExplainFormat format) const {
	auto print_format = ClientConfig::GetConfig(context).profiler_print_format;
	if (format == ExplainFormat::DEFAULT) {
		return print_format;
	}
	switch (format) {
	case ExplainFormat::TEXT:
		return ProfilerPrintFormat::QUERY_TREE;
	case ExplainFormat::JSON:
		return ProfilerPrintFormat::JSON;
	case ExplainFormat::HTML:
		return ProfilerPrintFormat::HTML;
	case ExplainFormat::GRAPHVIZ:
		return ProfilerPrintFormat::GRAPHVIZ;
	default:
		throw NotImplementedException("No mapping from ExplainFormat::%s to ProfilerPrintFormat",
		                              EnumUtil::ToString(format));
	}
}